

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_lockfree_queue.cpp
# Opt level: O2

void consumer(void)

{
  bool bVar1;
  int value;
  int local_24;
  
  while (((byte)done._M_base._M_i & 1) == 0) {
    while (bVar1 = boost::lockfree::queue<int>::pop<int>(&queue,&local_24), bVar1) {
      std::operator<<((ostream *)&std::cout,".");
      LOCK();
      consumer_count.super___atomic_base<int>._M_i =
           (__atomic_base<int>)((int)consumer_count.super___atomic_base<int>._M_i + 1);
      UNLOCK();
    }
  }
  while (bVar1 = boost::lockfree::queue<int>::pop<int>(&queue,&local_24), bVar1) {
    LOCK();
    consumer_count.super___atomic_base<int>._M_i =
         (__atomic_base<int>)((int)consumer_count.super___atomic_base<int>._M_i + 1);
    UNLOCK();
  }
  return;
}

Assistant:

void consumer(void)
{
	int value;

	while (!done) {
		while (queue.pop(value)) {
			cout << ".";
			++consumer_count;
		}
	}

	while (queue.pop(value))
		++consumer_count;
}